

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O1

void __thiscall RTIMU::RTIMU(RTIMU *this,RTIMUSettings *settings)

{
  long lVar1;
  RTFusionKalman4 *this_00;
  
  this->_vptr_RTIMU = (_func_int **)&PTR__RTIMU_0012a5d8;
  RTVector3::RTVector3(&(this->m_imuData).fusionPose);
  RTQuaternion::RTQuaternion(&(this->m_imuData).fusionQPose);
  RTVector3::RTVector3(&(this->m_imuData).gyro);
  RTVector3::RTVector3(&(this->m_imuData).accel);
  RTVector3::RTVector3(&(this->m_imuData).compass);
  RTVector3::RTVector3(&this->m_previousAccel);
  RTVector3::RTVector3(&this->m_compassAverage);
  this->m_settings = settings;
  this->m_compassCalibrationMode = false;
  this->m_accelCalibrationMode = false;
  this->m_runtimeMagCalValid = false;
  lVar1 = -3;
  do {
    this->m_runtimeMagCalMin[lVar1] = -1000.0;
    this[1].m_imuData.fusionPose.m_data[lVar1 + -7] = 1000.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  if (settings->m_fusionType == 1) {
    this_00 = (RTFusionKalman4 *)operator_new(0x2e8);
    RTFusionKalman4::RTFusionKalman4(this_00);
  }
  else if (settings->m_fusionType == 2) {
    this_00 = (RTFusionKalman4 *)operator_new(0xf0);
    RTFusionRTQF::RTFusionRTQF((RTFusionRTQF *)this_00);
  }
  else {
    this_00 = (RTFusionKalman4 *)operator_new(0xb8);
    RTFusion::RTFusion((RTFusion *)this_00);
  }
  this->m_fusion = &this_00->super_RTFusion;
  printf("Using fusion algorithm %s\n",RTFusion::m_fusionNameMap[this->m_settings->m_fusionType]);
  fflush(_stdout);
  return;
}

Assistant:

RTIMU::RTIMU(RTIMUSettings *settings)
{
    m_settings = settings;

    m_compassCalibrationMode = false;
    m_accelCalibrationMode = false;

    m_runtimeMagCalValid = false;

    for (int i = 0; i < 3; i++) {
        m_runtimeMagCalMax[i] = -1000;
        m_runtimeMagCalMin[i] = 1000;
    }

    switch (m_settings->m_fusionType) {
    case RTFUSION_TYPE_KALMANSTATE4:
        m_fusion = new RTFusionKalman4();
        break;

    case RTFUSION_TYPE_RTQF:
        m_fusion = new RTFusionRTQF();
        break;

    default:
        m_fusion = new RTFusion();
        break;
    }
    HAL_INFO1("Using fusion algorithm %s\n", RTFusion::fusionName(m_settings->m_fusionType));
}